

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O2

void __thiscall
amrex::algoim::
ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>,_false>
::evalIntegrand(ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>,_false>
                *this,GpuArray<double,_3U> x,Real w)

{
  double dVar1;
  int iVar2;
  EBPlane *pEVar3;
  GpuArray<double,_3U> x_00;
  uint uVar4;
  ulong uVar5;
  int j;
  int dim_1;
  long lVar6;
  ulong uVar7;
  int dim;
  long lVar8;
  bool bVar9;
  double dVar10;
  GpuArray<double,_4U> roots;
  
  roots.arr[0] = -0.5;
  pEVar3 = this->phi;
  iVar2 = this->e0;
  dVar1 = (pEVar3->norm).arr[iVar2];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    uVar7 = 0;
    uVar5 = (ulong)(uint)this->psiCount;
    if (this->psiCount < 1) {
      uVar5 = uVar7;
    }
    uVar4 = 1;
    for (; dVar10 = roots.arr[1], uVar7 != uVar5; uVar7 = uVar7 + 1) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        if ((this->free).arr[lVar8] == false) {
          x.arr[lVar8] = *(double *)
                          (&DAT_0060a6e0 +
                          (ulong)(((this->psi).arr[uVar7].bits >> ((uint)lVar8 & 0x1f) & 1) == 0) *
                          8);
        }
      }
      x.arr[iVar2] = -0.5;
      dVar10 = -0.5 - ((x.arr[2] - (pEVar3->cent).arr[2]) * (pEVar3->norm).arr[2] +
                      (x.arr[0] - (pEVar3->cent).arr[0]) * (pEVar3->norm).arr[0] +
                      (x.arr[1] - (pEVar3->cent).arr[1]) * (pEVar3->norm).arr[1]) / dVar1;
      if (ABS(dVar10) < 0.5) {
        lVar8 = (long)(int)uVar4;
        uVar4 = uVar4 + 1;
        roots.arr[lVar8] = dVar10;
      }
    }
    if ((uVar4 == 3) && (uVar4 = 3, roots.arr[2] < roots.arr[1])) {
      roots.arr[1] = roots.arr[2];
      roots.arr[2] = dVar10;
    }
  }
  else {
    uVar4 = 1;
  }
  roots.arr[(int)uVar4] = 0.5;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  while (uVar5 != uVar4) {
    uVar7 = uVar5 + 1;
    dVar1 = roots.arr[uVar5];
    lVar8 = uVar5 + 1;
    dVar10 = roots.arr[lVar8] - dVar1;
    uVar5 = uVar7;
    if (1.1102230246251565e-14 <= dVar10) {
      x.arr[this->e0] = (roots.arr[lVar8] + dVar1) * 0.5;
      iVar2 = this->psiCount;
      pEVar3 = this->phi;
      bVar9 = true;
      for (lVar8 = 0; (bVar9 && (lVar8 < iVar2)); lVar8 = lVar8 + 1) {
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          if ((this->free).arr[lVar6] == false) {
            x.arr[lVar6] = *(double *)
                            (&DAT_0060a6e0 +
                            (ulong)(((this->psi).arr[lVar8].bits >> ((uint)lVar6 & 0x1f) & 1) == 0)
                            * 8);
          }
        }
        bVar9 = (byte)((this->psi).arr[lVar8].bits & 0x18) !=
                (byte)(((x.arr[2] - (pEVar3->cent).arr[2]) * (pEVar3->norm).arr[2] +
                        (x.arr[0] - (pEVar3->cent).arr[0]) * (pEVar3->norm).arr[0] +
                        (x.arr[1] - (pEVar3->cent).arr[1]) * (pEVar3->norm).arr[1] <= 0.0) * '\x10')
        ;
      }
      if (bVar9) {
        for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
          x.arr[this->e0] = *(double *)((long)&DAT_00622f90 + lVar8) * dVar10 + dVar1;
          x_00.arr[1] = roots.arr[2];
          x_00.arr[0] = roots.arr[1];
          x_00.arr[2] = roots.arr[3];
          ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>::
          evalIntegrand(this->f,x_00,*(double *)((long)&DAT_00622fb0 + lVar8) * dVar10 * w);
        }
      }
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }